

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall
kj::MainBuilder::MainImpl::usageError(MainImpl *this,StringPtr programName,StringPtr message)

{
  ProcessContext *pPVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  char (*in_stack_ffffffffffffffb0) [31];
  String local_48;
  char *local_30;
  size_t local_28;
  char *local_20;
  size_t local_18;
  
  local_28 = message.content.size_;
  local_30 = message.content.ptr;
  local_18 = programName.content.size_;
  local_20 = programName.content.ptr;
  pPVar1 = ((this->impl).ptr)->context;
  str<kj::StringPtr&,char_const(&)[3],kj::StringPtr&,char_const(&)[7],kj::StringPtr&,char_const(&)[31]>
            (&local_48,(kj *)&local_20,(StringPtr *)0x1d6961,(char (*) [3])&local_30,
             (StringPtr *)"\nTry \'",(char (*) [7])&local_20,
             (StringPtr *)" --help\' for more information.",in_stack_ffffffffffffffb0);
  pcVar4 = local_48.content.ptr;
  if (local_48.content.size_ == 0) {
    pcVar4 = "";
  }
  iVar3 = (*pPVar1->_vptr_ProcessContext[4])
                    (pPVar1,pcVar4,local_48.content.size_ + (local_48.content.size_ == 0));
  sVar2 = local_48.content.size_;
  pcVar4 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (*(code *)**(undefined8 **)local_48.content.disposer)
              (local_48.content.disposer,pcVar4,1,sVar2,sVar2,0);
  }
  _Unwind_Resume(iVar3);
}

Assistant:

void MainBuilder::MainImpl::usageError(StringPtr programName, StringPtr message) {
  impl->context.exitError(kj::str(
      programName, ": ", message,
      "\nTry '", programName, " --help' for more information."));
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}